

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O3

void __thiscall icu_63::RuleChain::dumpRules(RuleChain *this,UnicodeString *result)

{
  short sVar1;
  int iVar2;
  RuleChain *pRVar3;
  UVector32 *pUVar4;
  int32_t srcLength;
  undefined4 uVar5;
  int iVar6;
  uint32_t i;
  long lVar7;
  OrConstraint *pOVar8;
  AndConstraint *pAVar9;
  UChar digitString [16];
  UnicodeString local_1f8;
  ConstChar16Ptr local_1b8;
  ConstChar16Ptr local_1b0;
  ConstChar16Ptr local_1a8;
  ConstChar16Ptr local_1a0;
  ConstChar16Ptr local_198;
  ConstChar16Ptr local_190;
  ConstChar16Ptr local_188;
  ConstChar16Ptr local_180;
  ConstChar16Ptr local_178;
  ConstChar16Ptr local_170;
  ConstChar16Ptr local_168;
  ConstChar16Ptr local_160;
  ConstChar16Ptr local_158;
  RuleChain *local_150;
  ConstChar16Ptr local_148;
  OrConstraint *local_140;
  char16_t *local_138;
  char16_t *local_128;
  char16_t *local_118;
  char16_t *local_108;
  char16_t *local_f8;
  char16_t *local_e8;
  char16_t *local_d8;
  char16_t *local_c8;
  char16_t *local_b8;
  char16_t *local_a8;
  char16_t *local_98;
  char16_t *local_88;
  char16_t *local_78;
  char16_t *local_68;
  UChar local_58 [20];
  
  local_150 = this;
  if (this->ruleHeader != (OrConstraint *)0x0) {
    sVar1 = (this->fKeyword).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      srcLength = (this->fKeyword).fUnion.fFields.fLength;
    }
    else {
      srcLength = (int)sVar1 >> 5;
    }
    icu_63::UnicodeString::doAppend(result,&this->fKeyword,0,srcLength);
    local_1f8.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x3a;
    icu_63::UnicodeString::doAppend(result,(UChar *)&local_1f8,0,1);
    local_1f8.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x20;
    icu_63::UnicodeString::doAppend(result,(UChar *)&local_1f8,0,1);
    pOVar8 = this->ruleHeader;
    if (pOVar8 != (OrConstraint *)0x0) {
      do {
        pAVar9 = pOVar8->childNode;
        local_140 = pOVar8;
        if (pAVar9 != (AndConstraint *)0x0) {
          do {
            if ((pAVar9->op == NONE) && (pAVar9->rangeList == (UVector32 *)0x0)) {
              if (pAVar9->value != -1) {
                tokenString(&local_1f8,pAVar9->digitsType);
                uVar5 = local_1f8.fUnion.fFields.fLength;
                if (-1 < local_1f8.fUnion.fStackFields.fLengthAndFlags) {
                  uVar5 = (int)local_1f8.fUnion.fStackFields.fLengthAndFlags >> 5;
                }
                icu_63::UnicodeString::doAppend(result,&local_1f8,0,uVar5);
                icu_63::UnicodeString::~UnicodeString(&local_1f8);
                local_158.p_ = L" is ";
                icu_63::UnicodeString::UnicodeString(&local_1f8,'\x01',&local_158,-1);
                uVar5 = local_1f8.fUnion.fFields.fLength;
                if (-1 < local_1f8.fUnion.fStackFields.fLengthAndFlags) {
                  uVar5 = (int)local_1f8.fUnion.fStackFields.fLengthAndFlags >> 5;
                }
                icu_63::UnicodeString::doAppend(result,&local_1f8,0,uVar5);
                icu_63::UnicodeString::~UnicodeString(&local_1f8);
                local_f8 = local_158.p_;
                if (pAVar9->negated != '\0') {
                  local_160.p_ = L"not ";
                  icu_63::UnicodeString::UnicodeString(&local_1f8,'\x01',&local_160,-1);
                  uVar5 = local_1f8.fUnion.fFields.fLength;
                  if (-1 < local_1f8.fUnion.fStackFields.fLengthAndFlags) {
                    uVar5 = (int)local_1f8.fUnion.fStackFields.fLengthAndFlags >> 5;
                  }
                  icu_63::UnicodeString::doAppend(result,&local_1f8,0,uVar5);
                  icu_63::UnicodeString::~UnicodeString(&local_1f8);
                  local_108 = local_160.p_;
                }
                uprv_itou_63(local_58,0x10,pAVar9->value,10,0);
                icu_63::UnicodeString::UnicodeString(&local_1f8,local_58);
                uVar5 = local_1f8.fUnion.fFields.fLength;
                if (-1 < local_1f8.fUnion.fStackFields.fLengthAndFlags) {
                  uVar5 = (int)local_1f8.fUnion.fStackFields.fLengthAndFlags >> 5;
                }
                icu_63::UnicodeString::doAppend(result,&local_1f8,0,uVar5);
LAB_002b8fa4:
                icu_63::UnicodeString::~UnicodeString(&local_1f8);
              }
            }
            else {
              tokenString(&local_1f8,pAVar9->digitsType);
              uVar5 = local_1f8.fUnion.fFields.fLength;
              if (-1 < local_1f8.fUnion.fStackFields.fLengthAndFlags) {
                uVar5 = (int)local_1f8.fUnion.fStackFields.fLengthAndFlags >> 5;
              }
              icu_63::UnicodeString::doAppend(result,&local_1f8,0,uVar5);
              icu_63::UnicodeString::~UnicodeString(&local_1f8);
              local_1f8.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x20;
              icu_63::UnicodeString::doAppend(result,(UChar *)&local_1f8,0,1);
              if (pAVar9->op == MOD) {
                local_168.p_ = L"mod ";
                icu_63::UnicodeString::UnicodeString(&local_1f8,'\x01',&local_168,-1);
                uVar5 = local_1f8.fUnion.fFields.fLength;
                if (-1 < local_1f8.fUnion.fStackFields.fLengthAndFlags) {
                  uVar5 = (int)local_1f8.fUnion.fStackFields.fLengthAndFlags >> 5;
                }
                icu_63::UnicodeString::doAppend(result,&local_1f8,0,uVar5);
                icu_63::UnicodeString::~UnicodeString(&local_1f8);
                local_68 = local_168.p_;
                uprv_itou_63(local_58,0x10,pAVar9->opNum,10,0);
                icu_63::UnicodeString::UnicodeString(&local_1f8,local_58);
                uVar5 = local_1f8.fUnion.fFields.fLength;
                if (-1 < local_1f8.fUnion.fStackFields.fLengthAndFlags) {
                  uVar5 = (int)local_1f8.fUnion.fStackFields.fLengthAndFlags >> 5;
                }
                icu_63::UnicodeString::doAppend(result,&local_1f8,0,uVar5);
                icu_63::UnicodeString::~UnicodeString(&local_1f8);
              }
              if (pAVar9->rangeList == (UVector32 *)0x0) {
                if (pAVar9->negated == '\0') {
                  local_178.p_ = L" is ";
                  icu_63::UnicodeString::UnicodeString(&local_1f8,'\x01',&local_178,-1);
                  uVar5 = local_1f8.fUnion.fFields.fLength;
                  if (-1 < local_1f8.fUnion.fStackFields.fLengthAndFlags) {
                    uVar5 = (int)local_1f8.fUnion.fStackFields.fLengthAndFlags >> 5;
                  }
                  icu_63::UnicodeString::doAppend(result,&local_1f8,0,uVar5);
                  icu_63::UnicodeString::~UnicodeString(&local_1f8);
                  local_e8 = local_178.p_;
                  uprv_itou_63(local_58,0x10,pAVar9->value,10,0);
                  icu_63::UnicodeString::UnicodeString(&local_1f8,local_58);
                  uVar5 = local_1f8.fUnion.fFields.fLength;
                  if (-1 < local_1f8.fUnion.fStackFields.fLengthAndFlags) {
                    uVar5 = (int)local_1f8.fUnion.fStackFields.fLengthAndFlags >> 5;
                  }
                  icu_63::UnicodeString::doAppend(result,&local_1f8,0,uVar5);
                }
                else {
                  local_170.p_ = L" is not ";
                  icu_63::UnicodeString::UnicodeString(&local_1f8,'\x01',&local_170,-1);
                  uVar5 = local_1f8.fUnion.fFields.fLength;
                  if (-1 < local_1f8.fUnion.fStackFields.fLengthAndFlags) {
                    uVar5 = (int)local_1f8.fUnion.fStackFields.fLengthAndFlags >> 5;
                  }
                  icu_63::UnicodeString::doAppend(result,&local_1f8,0,uVar5);
                  icu_63::UnicodeString::~UnicodeString(&local_1f8);
                  local_d8 = local_170.p_;
                  uprv_itou_63(local_58,0x10,pAVar9->value,10,0);
                  icu_63::UnicodeString::UnicodeString(&local_1f8,local_58);
                  uVar5 = local_1f8.fUnion.fFields.fLength;
                  if (-1 < local_1f8.fUnion.fStackFields.fLengthAndFlags) {
                    uVar5 = (int)local_1f8.fUnion.fStackFields.fLengthAndFlags >> 5;
                  }
                  icu_63::UnicodeString::doAppend(result,&local_1f8,0,uVar5);
                }
                goto LAB_002b8fa4;
              }
              if (pAVar9->negated == '\0') {
                if (pAVar9->integerOnly == '\0') {
                  local_198.p_ = L" within ";
                  icu_63::UnicodeString::UnicodeString(&local_1f8,'\x01',&local_198,-1);
                  uVar5 = local_1f8.fUnion.fFields.fLength;
                  if (-1 < local_1f8.fUnion.fStackFields.fLengthAndFlags) {
                    uVar5 = (int)local_1f8.fUnion.fStackFields.fLengthAndFlags >> 5;
                  }
                  icu_63::UnicodeString::doAppend(result,&local_1f8,0,uVar5);
                  icu_63::UnicodeString::~UnicodeString(&local_1f8);
                  local_a8 = local_198.p_;
                }
                else {
                  local_190.p_ = L" in ";
                  icu_63::UnicodeString::UnicodeString(&local_1f8,'\x01',&local_190,-1);
                  uVar5 = local_1f8.fUnion.fFields.fLength;
                  if (-1 < local_1f8.fUnion.fStackFields.fLengthAndFlags) {
                    uVar5 = (int)local_1f8.fUnion.fStackFields.fLengthAndFlags >> 5;
                  }
                  icu_63::UnicodeString::doAppend(result,&local_1f8,0,uVar5);
                  icu_63::UnicodeString::~UnicodeString(&local_1f8);
                  local_98 = local_190.p_;
                }
              }
              else if (pAVar9->integerOnly == '\0') {
                local_188.p_ = L" not within ";
                icu_63::UnicodeString::UnicodeString(&local_1f8,'\x01',&local_188,-1);
                uVar5 = local_1f8.fUnion.fFields.fLength;
                if (-1 < local_1f8.fUnion.fStackFields.fLengthAndFlags) {
                  uVar5 = (int)local_1f8.fUnion.fStackFields.fLengthAndFlags >> 5;
                }
                icu_63::UnicodeString::doAppend(result,&local_1f8,0,uVar5);
                icu_63::UnicodeString::~UnicodeString(&local_1f8);
                local_88 = local_188.p_;
              }
              else {
                local_180.p_ = L" not in ";
                icu_63::UnicodeString::UnicodeString(&local_1f8,'\x01',&local_180,-1);
                uVar5 = local_1f8.fUnion.fFields.fLength;
                if (-1 < local_1f8.fUnion.fStackFields.fLengthAndFlags) {
                  uVar5 = (int)local_1f8.fUnion.fStackFields.fLengthAndFlags >> 5;
                }
                icu_63::UnicodeString::doAppend(result,&local_1f8,0,uVar5);
                icu_63::UnicodeString::~UnicodeString(&local_1f8);
                local_78 = local_180.p_;
              }
              pUVar4 = pAVar9->rangeList;
              iVar6 = pUVar4->count;
              if (0 < iVar6) {
                lVar7 = 1;
                do {
                  i = 0;
                  if (lVar7 < iVar6) {
                    i = pUVar4->elements[lVar7];
                  }
                  uprv_itou_63(local_58,0x10,pUVar4->elements[lVar7 + -1],10,0);
                  icu_63::UnicodeString::UnicodeString(&local_1f8,local_58);
                  uVar5 = local_1f8.fUnion.fFields.fLength;
                  if (-1 < local_1f8.fUnion.fStackFields.fLengthAndFlags) {
                    uVar5 = (int)local_1f8.fUnion.fStackFields.fLengthAndFlags >> 5;
                  }
                  icu_63::UnicodeString::doAppend(result,&local_1f8,0,uVar5);
                  icu_63::UnicodeString::~UnicodeString(&local_1f8);
                  local_1a0.p_ = L"..";
                  icu_63::UnicodeString::UnicodeString(&local_1f8,'\x01',&local_1a0,-1);
                  uVar5 = local_1f8.fUnion.fFields.fLength;
                  if (-1 < local_1f8.fUnion.fStackFields.fLengthAndFlags) {
                    uVar5 = (int)local_1f8.fUnion.fStackFields.fLengthAndFlags >> 5;
                  }
                  icu_63::UnicodeString::doAppend(result,&local_1f8,0,uVar5);
                  icu_63::UnicodeString::~UnicodeString(&local_1f8);
                  local_b8 = local_1a0.p_;
                  uprv_itou_63(local_58,0x10,i,10,0);
                  icu_63::UnicodeString::UnicodeString(&local_1f8,local_58);
                  uVar5 = local_1f8.fUnion.fFields.fLength;
                  if (-1 < local_1f8.fUnion.fStackFields.fLengthAndFlags) {
                    uVar5 = (int)local_1f8.fUnion.fStackFields.fLengthAndFlags >> 5;
                  }
                  icu_63::UnicodeString::doAppend(result,&local_1f8,0,uVar5);
                  icu_63::UnicodeString::~UnicodeString(&local_1f8);
                  pUVar4 = pAVar9->rangeList;
                  iVar6 = pUVar4->count;
                  iVar2 = (int)lVar7;
                  if (iVar2 + 1 < iVar6) {
                    local_1a8.p_ = L", ";
                    icu_63::UnicodeString::UnicodeString(&local_1f8,'\x01',&local_1a8,-1);
                    uVar5 = local_1f8.fUnion.fFields.fLength;
                    if (-1 < local_1f8.fUnion.fStackFields.fLengthAndFlags) {
                      uVar5 = (int)local_1f8.fUnion.fStackFields.fLengthAndFlags >> 5;
                    }
                    icu_63::UnicodeString::doAppend(result,&local_1f8,0,uVar5);
                    icu_63::UnicodeString::~UnicodeString(&local_1f8);
                    local_c8 = local_1a8.p_;
                    pUVar4 = pAVar9->rangeList;
                    iVar6 = pUVar4->count;
                  }
                  lVar7 = lVar7 + 2;
                } while (iVar2 + 1 < iVar6);
              }
            }
            pAVar9 = pAVar9->next;
            if (pAVar9 == (AndConstraint *)0x0) break;
            local_1b0.p_ = L" and ";
            icu_63::UnicodeString::UnicodeString(&local_1f8,'\x01',&local_1b0,-1);
            uVar5 = local_1f8.fUnion.fFields.fLength;
            if (-1 < local_1f8.fUnion.fStackFields.fLengthAndFlags) {
              uVar5 = (int)local_1f8.fUnion.fStackFields.fLengthAndFlags >> 5;
            }
            icu_63::UnicodeString::doAppend(result,&local_1f8,0,uVar5);
            icu_63::UnicodeString::~UnicodeString(&local_1f8);
            local_118 = local_1b0.p_;
          } while( true );
        }
        pOVar8 = local_140->next;
        if (pOVar8 == (OrConstraint *)0x0) break;
        local_1b8.p_ = L" or ";
        icu_63::UnicodeString::UnicodeString(&local_1f8,'\x01',&local_1b8,-1);
        uVar5 = local_1f8.fUnion.fFields.fLength;
        if (-1 < local_1f8.fUnion.fStackFields.fLengthAndFlags) {
          uVar5 = (int)local_1f8.fUnion.fStackFields.fLengthAndFlags >> 5;
        }
        icu_63::UnicodeString::doAppend(result,&local_1f8,0,uVar5);
        icu_63::UnicodeString::~UnicodeString(&local_1f8);
        local_128 = local_1b8.p_;
      } while( true );
    }
  }
  pRVar3 = local_150;
  if (local_150->fNext != (RuleChain *)0x0) {
    local_148.p_ = L"; ";
    icu_63::UnicodeString::UnicodeString(&local_1f8,'\x01',&local_148,-1);
    if (-1 < local_1f8.fUnion.fStackFields.fLengthAndFlags) {
      local_1f8.fUnion.fFields.fLength = (int)local_1f8.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    icu_63::UnicodeString::doAppend(result,&local_1f8,0,local_1f8.fUnion.fFields.fLength);
    icu_63::UnicodeString::~UnicodeString(&local_1f8);
    local_138 = local_148.p_;
    dumpRules(pRVar3->fNext,result);
  }
  return;
}

Assistant:

void
RuleChain::dumpRules(UnicodeString& result) {
    UChar digitString[16];

    if ( ruleHeader != nullptr ) {
        result +=  fKeyword;
        result += COLON;
        result += SPACE;
        OrConstraint* orRule=ruleHeader;
        while ( orRule != nullptr ) {
            AndConstraint* andRule=orRule->childNode;
            while ( andRule != nullptr ) {
                if ((andRule->op==AndConstraint::NONE) &&  (andRule->rangeList==nullptr) && (andRule->value == -1)) {
                    // Empty Rules.
                } else if ( (andRule->op==AndConstraint::NONE) && (andRule->rangeList==nullptr) ) {
                    result += tokenString(andRule->digitsType);
                    result += UNICODE_STRING_SIMPLE(" is ");
                    if (andRule->negated) {
                        result += UNICODE_STRING_SIMPLE("not ");
                    }
                    uprv_itou(digitString,16, andRule->value,10,0);
                    result += UnicodeString(digitString);
                }
                else {
                    result += tokenString(andRule->digitsType);
                    result += SPACE;
                    if (andRule->op==AndConstraint::MOD) {
                        result += UNICODE_STRING_SIMPLE("mod ");
                        uprv_itou(digitString,16, andRule->opNum,10,0);
                        result += UnicodeString(digitString);
                    }
                    if (andRule->rangeList==nullptr) {
                        if (andRule->negated) {
                            result += UNICODE_STRING_SIMPLE(" is not ");
                            uprv_itou(digitString,16, andRule->value,10,0);
                            result += UnicodeString(digitString);
                        }
                        else {
                            result += UNICODE_STRING_SIMPLE(" is ");
                            uprv_itou(digitString,16, andRule->value,10,0);
                            result += UnicodeString(digitString);
                        }
                    }
                    else {
                        if (andRule->negated) {
                            if ( andRule->integerOnly ) {
                                result += UNICODE_STRING_SIMPLE(" not in ");
                            }
                            else {
                                result += UNICODE_STRING_SIMPLE(" not within ");
                            }
                        }
                        else {
                            if ( andRule->integerOnly ) {
                                result += UNICODE_STRING_SIMPLE(" in ");
                            }
                            else {
                                result += UNICODE_STRING_SIMPLE(" within ");
                            }
                        }
                        for (int32_t r=0; r<andRule->rangeList->size(); r+=2) {
                            int32_t rangeLo = andRule->rangeList->elementAti(r);
                            int32_t rangeHi = andRule->rangeList->elementAti(r+1);
                            uprv_itou(digitString,16, rangeLo, 10, 0);
                            result += UnicodeString(digitString);
                            result += UNICODE_STRING_SIMPLE("..");
                            uprv_itou(digitString,16, rangeHi, 10,0);
                            result += UnicodeString(digitString);
                            if (r+2 < andRule->rangeList->size()) {
                                result += UNICODE_STRING_SIMPLE(", ");
                            }
                        }
                    }
                }
                if ( (andRule=andRule->next) != nullptr) {
                    result += UNICODE_STRING_SIMPLE(" and ");
                }
            }
            if ( (orRule = orRule->next) != nullptr ) {
                result += UNICODE_STRING_SIMPLE(" or ");
            }
        }
    }
    if ( fNext != nullptr ) {
        result += UNICODE_STRING_SIMPLE("; ");
        fNext->dumpRules(result);
    }
}